

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

uint16 crnd::crc16(void *pBuf,uint32 len,uint16 crc)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  
  uVar1 = ~(uint)crc;
  for (lVar2 = 0; len != (uint32)lVar2; lVar2 = lVar2 + 1) {
    uVar3 = (uVar1 & 0xffff) >> 8 ^ (uint)*(byte *)((long)pBuf + lVar2);
    uVar3 = uVar3 >> 4 ^ uVar3;
    uVar1 = uVar3 << 0xc ^ uVar3 << 5 ^ (uVar1 << 8 | uVar3);
  }
  return ~(ushort)uVar1;
}

Assistant:

uint16 crc16(const void* pBuf, uint32 len, uint16 crc) {
  crc = ~crc;

  const uint8* p = reinterpret_cast<const uint8*>(pBuf);
  while (len) {
    const uint16 q = *p++ ^ (crc >> 8U);
    crc <<= 8U;

    uint16 r = (q >> 4U) ^ q;
    crc ^= r;
    r <<= 5U;
    crc ^= r;
    r <<= 7U;
    crc ^= r;

    len--;
  }

  return static_cast<uint16>(~crc);
}